

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

bool __thiscall
libtorrent::torrent_info::parse_info_section
          (torrent_info *this,bdecode_node *info,error_code *ec,int max_pieces)

{
  sha256_hash *this_00;
  shared_array<char> *this_01;
  info_hash_t *this_02;
  bool bVar1;
  bool bVar2;
  type_t tVar3;
  int iVar4;
  char *pcVar5;
  char *p;
  ptrdiff_t pVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  file_storage *pfVar10;
  error_code_enum eVar11;
  long lVar12;
  int i;
  uint uVar13;
  int iVar14;
  span<char> error;
  string_view key;
  string_view key_00;
  span<const_char> sVar15;
  span<const_char> sVar16;
  string_view sVar17;
  string_view key_01;
  string_view key_02;
  string_view element;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  int local_3d0;
  int local_3a8;
  int local_3a4;
  info_hash_t *local_3a0;
  string name;
  bdecode_node pieces;
  bdecode_node files_node;
  bdecode_node collections;
  bdecode_node similar;
  file_storage files;
  bdecode_node name_ent;
  file_storage v1_files;
  bdecode_node str;
  bdecode_node file_tree_node;
  
  tVar3 = bdecode_node::type(info);
  if (tVar3 != dict_t) {
    eVar11 = torrent_info_no_dict;
    goto LAB_0031b666;
  }
  sVar15 = bdecode_node::data_section(info);
  pcVar5 = sVar15.m_ptr;
  lcrypto::hasher::hasher((hasher *)&v1_files,sVar15);
  lcrypto::hasher::final((sha1_hash *)&files,(hasher *)&v1_files);
  (this->m_info_hash).v1.m_number._M_elems[4] =
       (uint)files.m_files.
             super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
             .
             super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(this->m_info_hash).v1.m_number._M_elems =
       CONCAT44(files.m_num_pieces,files.m_piece_length);
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = files._8_8_;
  lcrypto::hasher::~hasher((hasher *)&v1_files);
  lcrypto::hasher256::hasher256((hasher256 *)&v1_files,sVar15);
  lcrypto::hasher256::final((sha256_hash *)&files,(hasher256 *)&v1_files);
  *(ulong *)((this->m_info_hash).v2.m_number._M_elems + 4) =
       CONCAT44(files.m_files.
                super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                .
                super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                (uint)files.m_files.
                      super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                      .
                      super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  *(pointer *)((this->m_info_hash).v2.m_number._M_elems + 6) =
       files.m_files.
       super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
       super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(ulong *)(this->m_info_hash).v2.m_number._M_elems =
       CONCAT44(files.m_num_pieces,files.m_piece_length);
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 2) = files._8_8_;
  lcrypto::hasher256::~hasher256((hasher256 *)&v1_files);
  sVar16 = bdecode_node::data_section(info);
  if (0x7ffffffe < sVar16.m_len) {
    eVar11 = metadata_too_large;
    goto LAB_0031b666;
  }
  if (((sVar15.m_len == 0) || (*pcVar5 != 'd')) || (pcVar5[sVar15.m_len + -1] != 'e')) {
LAB_0031b65b:
    eVar11 = invalid_bencoding;
LAB_0031b666:
    boost::system::error_code::operator=(ec,eVar11);
    return false;
  }
  this_00 = &(this->m_info_hash).v2;
  this->m_info_section_size = (int)sVar15.m_len;
  this_01 = &this->m_info_section;
  p = (char *)operator_new__((long)(int)sVar15.m_len);
  boost::shared_array<char>::reset<char>(this_01,p);
  memcpy((this->m_info_section).px,pcVar5,(long)this->m_info_section_size);
  pVar6 = bdecode_node::data_offset(info);
  sVar17._M_str = "meta version";
  sVar17._M_len = 0xc;
  iVar7 = bdecode_node::dict_find_int_value(info,sVar17,-1);
  uVar13 = (uint)iVar7;
  if ((int)uVar13 < 1) {
LAB_0031b698:
    digest32<256L>::clear(this_00);
    bVar1 = false;
  }
  else {
    error.m_len = 200;
    error.m_ptr = (char *)&files;
    bVar1 = bdecode_node::has_soft_error(info,error);
    if (bVar1) goto LAB_0031b65b;
    eVar11 = torrent_unknown_version;
    if (2 < uVar13) goto LAB_0031b666;
    bVar1 = true;
    if (uVar13 == 1) goto LAB_0031b698;
  }
  key._M_str = "piece length";
  key._M_len = 0xc;
  uVar8 = bdecode_node::dict_find_int_value(info,key,-1);
  if ((uVar8 - 0x1fffc001 < 0xffffffffe0004000) ||
     ((bVar1 && ((uVar8 < 0x4000 ||
                 (uVar9 = uVar8 - (uVar8 >> 1 & 0x5555555555555555),
                 uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333),
                 1 < (byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))
                 ))))) {
    eVar11 = torrent_missing_piece_length;
    goto LAB_0031b666;
  }
  file_storage::file_storage(&files);
  files.m_piece_length = (int)uVar8;
  key_01._M_str = "name.utf-8";
  key_01._M_len = 10;
  pcVar5 = "name.utf-8";
  bdecode_node::dict_find_string(&name_ent,info,key_01);
  bVar2 = bdecode_node::operator_cast_to_bool(&name_ent);
  if (!bVar2) {
    key_02._M_str = "name";
    key_02._M_len = 4;
    pcVar5 = "name";
    bdecode_node::dict_find_string((bdecode_node *)&v1_files,info,key_02);
    bdecode_node::operator=(&name_ent,(bdecode_node *)&v1_files);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&v1_files);
  }
  bVar2 = bdecode_node::operator_cast_to_bool(&name_ent);
  if (!bVar2) {
    boost::system::error_code::operator=(ec,torrent_missing_name);
    (this->m_files).m_piece_length = 0;
    bVar1 = false;
    goto LAB_0031bc93;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  sVar17 = bdecode_node::string_value(&name_ent);
  element._M_len = sVar17._M_str;
  element._M_str = pcVar5;
  aux::sanitize_append_path_element((aux *)&name,(string *)sVar17._M_len,element);
  this_02 = &this->m_info_hash;
  local_3a0 = this_02;
  if (name._M_string_length == 0) {
    bVar2 = info_hash_t::has_v1(this_02);
    if (bVar2) {
      sVar16.m_len = (difference_type)pcVar5;
      sVar16.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)&v1_files,(aux *)this_02,sVar16);
    }
    else {
      sVar15.m_len = (difference_type)pcVar5;
      sVar15.m_ptr = (char *)0x20;
      aux::to_hex_abi_cxx11_((string *)&v1_files,(aux *)this_00,sVar15);
    }
    ::std::__cxx11::string::operator=((string *)&name,(string *)&v1_files);
    ::std::__cxx11::string::~string((string *)&v1_files);
  }
  file_storage::file_storage(&v1_files);
  if (bVar1) {
    file_storage::operator=(&v1_files,&files);
  }
  key_03._M_str = "files";
  key_03._M_len = 5;
  bdecode_node::dict_find_list(&files_node,info,key_03);
  key_04._M_str = "file tree";
  key_04._M_len = 9;
  bdecode_node::dict_find_dict(&file_tree_node,info,key_04);
  bVar2 = bdecode_node::operator_cast_to_bool(&file_tree_node);
  if (bVar1) {
    if (bVar2) {
      pcVar5 = this_01->px;
      bVar2 = bdecode_node::operator_cast_to_bool(&files_node);
      bVar2 = anon_unknown_1::extract_files2(&file_tree_node,&files,&name,pVar6,pcVar5,bVar2,0,ec);
      if (bVar2) {
        file_storage::sanitize_symlinks(&files);
        iVar4 = file_storage::num_files(&files);
        (this->m_flags).m_val = (this->m_flags).m_val & 0xfe | 1 < iVar4;
        goto LAB_0031b9a5;
      }
LAB_0031bc5d:
      (this->m_files).m_piece_length = 0;
    }
    else {
      (this->m_files).m_piece_length = 0;
      eVar11 = torrent_missing_file_tree;
LAB_0031ba8a:
      boost::system::error_code::operator=(ec,eVar11);
    }
    bVar1 = false;
  }
  else {
    if (bVar2) {
      (this->m_files).m_piece_length = 0;
      eVar11 = torrent_missing_meta_version;
      goto LAB_0031ba8a;
    }
LAB_0031b9a5:
    bVar2 = bdecode_node::operator_cast_to_bool(&files_node);
    if (bVar2) {
      pfVar10 = &files;
      if (uVar13 == 2) {
        pfVar10 = &v1_files;
      }
      pcVar5 = this_01->px;
      tVar3 = bdecode_node::type(&files_node);
      if (tVar3 == list_t) {
        iVar4 = bdecode_node::list_size(&files_node);
        file_storage::reserve(pfVar10,iVar4);
        iVar4 = bdecode_node::list_size(&files_node);
        iVar14 = 0;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        do {
          if (iVar4 == iVar14) {
            file_storage::sanitize_symlinks(pfVar10);
            (this->m_flags).m_val = (this->m_flags).m_val | 1;
            goto LAB_0031bb75;
          }
          bdecode_node::list_at(&pieces,&files_node,iVar14);
          bVar2 = anon_unknown_1::extract_single_file(&pieces,pfVar10,&name,pVar6,pcVar5,false,ec);
          ::std::
          _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           *)&pieces);
          iVar14 = iVar14 + 1;
        } while (bVar2);
        goto LAB_0031bc5d;
      }
      eVar11 = torrent_file_parse_failed;
LAB_0031bc54:
      boost::system::error_code::operator=(ec,eVar11);
      goto LAB_0031bc5d;
    }
    if (bVar1) {
      key_05._M_str = "length";
      key_05._M_len = 6;
      bdecode_node::dict_find(&pieces,info,key_05);
      bVar2 = bdecode_node::operator_cast_to_bool(&pieces);
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&pieces);
      if (bVar2) goto LAB_0031bade;
      digest32<160L>::clear(&local_3a0->v1);
    }
    else {
LAB_0031bade:
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pieces,"",(allocator<char> *)&similar);
      pfVar10 = &files;
      if (uVar13 == 2) {
        pfVar10 = &v1_files;
      }
      bVar2 = anon_unknown_1::extract_single_file
                        (info,pfVar10,(string *)&pieces,pVar6,this_01->px,true,ec);
      ::std::__cxx11::string::~string((string *)&pieces);
      if (!bVar2) goto LAB_0031bc5d;
      (this->m_flags).m_val = (this->m_flags).m_val & 0xfe;
    }
LAB_0031bb75:
    iVar4 = file_storage::num_files(&files);
    if (iVar4 == 0) {
      eVar11 = no_files_in_torrent;
      goto LAB_0031bc54;
    }
    if (files.m_name._M_string_length == 0) {
      eVar11 = torrent_missing_name;
      goto LAB_0031bc54;
    }
    if ((bVar1) && (iVar4 = file_storage::num_files(&v1_files), 0 < iVar4)) {
      iVar4 = file_storage::num_files(&files);
      iVar14 = file_storage::num_files(&v1_files);
      if (iVar4 == iVar14 + 1) {
        file_storage::remove_tail_padding(&files);
      }
      bVar2 = aux::files_compatible(&files,&v1_files);
      if (!bVar2) {
        (this->m_files).m_piece_length = 0;
        eVar11 = torrent_inconsistent_files;
        goto LAB_0031ba8a;
      }
    }
    lVar12 = (long)files.m_piece_length;
    if ((0x3fffffff < files.m_total_size / lVar12) ||
       (files.m_num_pieces = (int)((files.m_total_size + lVar12 + -1) / lVar12),
       0x6666665 < files.m_num_pieces || max_pieces < files.m_num_pieces)) {
      eVar11 = too_many_pieces_in_torrent;
      goto LAB_0031bc54;
    }
    key_06._M_str = "pieces";
    key_06._M_len = 6;
    bdecode_node::dict_find_string(&pieces,info,key_06);
    bVar2 = bdecode_node::operator_cast_to_bool(&pieces);
    local_3d0 = (int)pVar6;
    if (bVar2) {
      iVar4 = bdecode_node::string_length(&pieces);
      if (iVar4 == files.m_num_pieces * 0x14) {
        pVar6 = bdecode_node::string_offset(&pieces);
        this->m_piece_hashes = (int)pVar6 - local_3d0;
        goto LAB_0031bd2e;
      }
      eVar11 = torrent_invalid_hashes;
LAB_0031bf59:
      boost::system::error_code::operator=(ec,eVar11);
      (this->m_files).m_piece_length = 0;
      bVar1 = false;
    }
    else {
      if (!bVar1) {
        eVar11 = torrent_missing_pieces;
        goto LAB_0031bf59;
      }
LAB_0031bd2e:
      key_00._M_str = "private";
      key_00._M_len = 7;
      iVar7 = bdecode_node::dict_find_int_value(info,key_00,0);
      (this->m_flags).m_val = (this->m_flags).m_val | (iVar7 != 0) * '\x02';
      key_07._M_str = "similar";
      key_07._M_len = 7;
      bdecode_node::dict_find_list(&similar,info,key_07);
      bVar1 = bdecode_node::operator_cast_to_bool(&similar);
      if (bVar1) {
        iVar4 = 0;
        while( true ) {
          iVar14 = bdecode_node::list_size(&similar);
          if (iVar14 <= iVar4) break;
          bdecode_node::list_at(&collections,&similar,iVar4);
          tVar3 = bdecode_node::type(&collections);
          ::std::
          _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           *)&collections);
          if (tVar3 == string_t) {
            bdecode_node::list_at(&collections,&similar,iVar4);
            iVar14 = bdecode_node::string_length(&collections);
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&collections);
            if (iVar14 == 0x14) {
              bdecode_node::list_at(&collections,&similar,iVar4);
              pVar6 = bdecode_node::string_offset(&collections);
              str.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)pVar6 - local_3d0;
              ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        (&this->m_similar_torrents,(int *)&str);
              ::std::
              _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               *)&collections);
            }
          }
          iVar4 = iVar4 + 1;
        }
      }
      key_08._M_str = "collections";
      key_08._M_len = 0xb;
      bdecode_node::dict_find_list(&collections,info,key_08);
      bVar1 = bdecode_node::operator_cast_to_bool(&collections);
      if (bVar1) {
        for (iVar4 = 0; iVar14 = bdecode_node::list_size(&collections), iVar4 < iVar14;
            iVar4 = iVar4 + 1) {
          bdecode_node::list_at(&str,&collections,iVar4);
          tVar3 = bdecode_node::type(&str);
          if (tVar3 == string_t) {
            pVar6 = bdecode_node::string_offset(&str);
            local_3a4 = (int)pVar6 - local_3d0;
            local_3a8 = bdecode_node::string_length(&str);
            ::std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<int,int>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                       &this->m_collections,&local_3a4,&local_3a8);
          }
          ::std::
          _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           *)&str);
        }
      }
      key_09._M_str = "ssl-cert";
      key_09._M_len = 8;
      bdecode_node::dict_find_string(&str,info,key_09);
      bVar1 = bdecode_node::operator_cast_to_bool(&str);
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&str);
      if (bVar1) {
        (this->m_flags).m_val = (this->m_flags).m_val | 8;
      }
      bVar1 = files.m_total_size != 0;
      if (files.m_total_size == 0) {
        boost::system::error_code::operator=(ec,torrent_invalid_length);
        (this->m_files).m_piece_length = 0;
      }
      else {
        file_storage::swap(&this->m_files,&files);
      }
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&collections);
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&similar);
    }
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&pieces);
  }
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&file_tree_node);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&files_node);
  file_storage::~file_storage(&v1_files);
  ::std::__cxx11::string::~string((string *)&name);
LAB_0031bc93:
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&name_ent);
  file_storage::~file_storage(&files);
  return bVar1;
}

Assistant:

bool torrent_info::parse_info_section(bdecode_node const& info
		, error_code& ec, int const max_pieces)
	{
		if (info.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_info_no_dict;
			return false;
		}

		// hash the info-field to calculate info-hash
		auto section = info.data_section();
		m_info_hash.v1 = hasher(section).final();
		m_info_hash.v2 = hasher256(section).final();
		if (info.data_section().size() >= std::numeric_limits<int>::max())
		{
			ec = errors::metadata_too_large;
			return false;
		}

		if (section.empty() || section[0] != 'd' || section[section.size() - 1] != 'e')
		{
			ec = errors::invalid_bencoding;
			return false;
		}

		// copy the info section
		m_info_section_size = int(section.size());
		m_info_section.reset(new char[aux::numeric_cast<std::size_t>(m_info_section_size)]);
		std::memcpy(m_info_section.get(), section.data(), aux::numeric_cast<std::size_t>(m_info_section_size));

		// this is the offset from the start of the torrent file buffer to the
		// info-dictionary (within the torrent file).
		// we need this because we copy just the info dictionary buffer and pull
		// out parsed data (strings) from the bdecode_node and need to make them
		// point into our copy of the buffer.
		std::ptrdiff_t const info_offset = info.data_offset();

		// check for a version key
		int const version = int(info.dict_find_int_value("meta version", -1));
		if (version > 0)
		{
			char error_string[200];
			if (info.has_soft_error(error_string))
			{
				ec = errors::invalid_bencoding;
				return false;
			}

			if (version > 2)
			{
				ec = errors::torrent_unknown_version;
				return false;
			}
		}

		if (version < 2)
		{
			// this is a v1 torrent so the v2 info hash has no meaning
			// clear it just to make sure no one tries to use it
			m_info_hash.v2.clear();
		}

		// extract piece length
		std::int64_t const piece_length = info.dict_find_int_value("piece length", -1);
		if (piece_length <= 0 || piece_length > file_storage::max_piece_size)
		{
			ec = errors::torrent_missing_piece_length;
			return false;
		}

		// according to BEP 52: "It must be a power of two and at least 16KiB."
		if (version > 1 && (piece_length < default_block_size
			|| (piece_length & (piece_length - 1)) != 0))
		{
			ec = errors::torrent_missing_piece_length;
			return false;
		}

		file_storage files;
		files.set_piece_length(static_cast<int>(piece_length));

		// extract file name (or the directory name if it's a multi file libtorrent)
		bdecode_node name_ent = info.dict_find_string("name.utf-8");
		if (!name_ent) name_ent = info.dict_find_string("name");
		if (!name_ent)
		{
			ec = errors::torrent_missing_name;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		std::string name;
		aux::sanitize_append_path_element(name, name_ent.string_value());
		if (name.empty())
		{
			if (m_info_hash.has_v1())
				name = aux::to_hex(m_info_hash.v1);
			else
				name = aux::to_hex(m_info_hash.v2);
		}

		// extract file list

		// save a copy so that we can extract both v1 and v2 files then compare the results
		file_storage v1_files;
		if (version >= 2)
			v1_files = files;

		bdecode_node const files_node = info.dict_find_list("files");

		bdecode_node file_tree_node = info.dict_find_dict("file tree");
		if (version >= 2 && file_tree_node)
		{
			if (!extract_files2(file_tree_node, files, name, info_offset
				, m_info_section.get(), bool(files_node), 0, ec))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}

			files.sanitize_symlinks();
			if (files.num_files() > 1)
				m_flags |= multifile;
			else
				m_flags &= ~multifile;
		}
		else if (version >= 2)
		{
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			ec = errors::torrent_missing_file_tree;
			return false;
		}
		else if (file_tree_node)
		{
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			ec = errors::torrent_missing_meta_version;
			return false;
		}

		if (!files_node)
		{
			// if this is a v2 torrent it is ok for the length key to be missing
			// that means it is a v2 only torrent
			if (version < 2 || info.dict_find("length"))
			{
				// if there's no list of files, there has to be a length
				// field.
				if (!extract_single_file(info, version == 2 ? v1_files : files, ""
					, info_offset, m_info_section.get(), true, ec))
				{
					// mark the torrent as invalid
					m_files.set_piece_length(0);
					return false;
				}

				m_flags &= ~multifile;
			}
			else
			{
				// this is a v2 only torrent so clear the v1 info hash to make sure no one uses it
				m_info_hash.v1.clear();
			}
		}
		else
		{
			if (!extract_files(files_node, version == 2 ? v1_files : files, name
				, info_offset, m_info_section.get(), ec))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
			m_flags |= multifile;
		}
		if (files.num_files() == 0)
		{
			ec = errors::no_files_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}
		if (files.name().empty())
		{
			ec = errors::torrent_missing_name;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		// ensure hybrid torrents have compatible v1 and v2 file storages
		if (version >= 2 && v1_files.num_files() > 0)
		{
			// previous versions of libtorrent did not not create hybrid
			// torrents with "tail-padding". When loading, accept both.
			if (files.num_files() == v1_files.num_files() + 1)
			{
				files.remove_tail_padding();
			}

			if (!aux::files_compatible(files, v1_files))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				ec = errors::torrent_inconsistent_files;
				return false;
			}
		}

		// extract SHA-1 hashes for all pieces
		// we want this division to round upwards, that's why we have the
		// extra addition

		if (files.total_size() / files.piece_length() > file_storage::max_num_pieces)
		{
			ec = errors::too_many_pieces_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		files.set_num_pieces(int((files.total_size() + files.piece_length() - 1)
			/ files.piece_length()));

		// we expect the piece hashes to be < 2 GB in size
		if (files.num_pieces() >= std::numeric_limits<int>::max() / 20
			|| files.num_pieces() > max_pieces)
		{
			ec = errors::too_many_pieces_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		bdecode_node const pieces = info.dict_find_string("pieces");
		if (!pieces)
		{
			if (version < 2)
			{
				ec = errors::torrent_missing_pieces;
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
		}
		else
		{
			if (pieces.string_length() != files.num_pieces() * 20)
			{
				ec = errors::torrent_invalid_hashes;
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}

			std::ptrdiff_t const hash_offset = pieces.string_offset() - info_offset;
			TORRENT_ASSERT(hash_offset < std::numeric_limits<std::int32_t>::max());
			TORRENT_ASSERT(hash_offset >= 0);
			m_piece_hashes = static_cast<std::int32_t>(hash_offset);
			TORRENT_ASSERT(m_piece_hashes > 0);
			TORRENT_ASSERT(m_piece_hashes < m_info_section_size);
		}

		m_flags |= (info.dict_find_int_value("private", 0) != 0)
			? private_torrent : torrent_info_flags_t{};

#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		bdecode_node const similar = info.dict_find_list("similar");
		if (similar)
		{
			for (int i = 0; i < similar.list_size(); ++i)
			{
				if (similar.list_at(i).type() != bdecode_node::string_t)
					continue;

				if (similar.list_at(i).string_length() != 20)
					continue;
				m_similar_torrents.push_back(static_cast<std::int32_t>(
					similar.list_at(i).string_offset() - info_offset));
			}
		}

		bdecode_node const collections = info.dict_find_list("collections");
		if (collections)
		{
			for (int i = 0; i < collections.list_size(); ++i)
			{
				bdecode_node const str = collections.list_at(i);

				if (str.type() != bdecode_node::string_t) continue;

				m_collections.emplace_back(
					aux::numeric_cast<std::int32_t>(str.string_offset() - info_offset)
					, str.string_length());
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

		if (info.dict_find_string("ssl-cert"))
			m_flags |= ssl_torrent;

		if (files.total_size() == 0)
		{
			ec = errors::torrent_invalid_length;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		// now, commit the files structure we just parsed out
		// into the torrent_info object.
		m_files.swap(files);

		TORRENT_ASSERT(m_info_hash.has_v2() == m_files.v2());
		return true;
	}